

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendRawNZ(JsonString *p,char *zIn,u32 N)

{
  u32 N_local;
  char *zIn_local;
  JsonString *p_local;
  
  if ((ulong)N + p->nUsed < p->nAlloc) {
    memcpy(p->zBuf + p->nUsed,zIn,(ulong)N);
    p->nUsed = (ulong)N + p->nUsed;
  }
  else {
    jsonStringExpandAndAppend(p,zIn,N);
  }
  return;
}

Assistant:

static void jsonAppendRawNZ(JsonString *p, const char *zIn, u32 N){
  assert( N>0 );
  if( N+p->nUsed >= p->nAlloc ){
    jsonStringExpandAndAppend(p,zIn,N);
  }else{
    memcpy(p->zBuf+p->nUsed, zIn, N);
    p->nUsed += N;
  }
}